

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

protocol_descriptor * libtorrent::dht::node::map_protocol_to_descriptor(udp protocol)

{
  int iVar1;
  long lVar2;
  
  if (map_protocol_to_descriptor(libtorrent::udp)::descriptors == '\0') {
    iVar1 = __cxa_guard_acquire(&map_protocol_to_descriptor(libtorrent::udp)::descriptors);
    if (iVar1 != 0) {
      map_protocol_to_descriptor::descriptors._M_elems[0].protocol.super_udp.family_ = (udp)2;
      map_protocol_to_descriptor::descriptors._M_elems[0].family_name = "n4";
      map_protocol_to_descriptor::descriptors._M_elems[0].nodes_key = "nodes";
      map_protocol_to_descriptor::descriptors._M_elems[1].protocol.super_udp.family_ = (udp)10;
      map_protocol_to_descriptor::descriptors._M_elems[1].family_name = "n6";
      map_protocol_to_descriptor::descriptors._M_elems[1].nodes_key = "nodes6";
      __cxa_guard_release(&map_protocol_to_descriptor(libtorrent::udp)::descriptors);
    }
  }
  if (map_protocol_to_descriptor::descriptors._M_elems[0].protocol.super_udp.family_ ==
      protocol.super_udp.family_) {
    lVar2 = 0;
  }
  else {
    if (map_protocol_to_descriptor::descriptors._M_elems[1].protocol.super_udp.family_ !=
        protocol.super_udp.family_) {
      aux::throw_ex<std::out_of_range,char_const(&)[17]>((char (*) [17])"unknown protocol");
    }
    lVar2 = 0x18;
  }
  return (protocol_descriptor *)
         ((long)&map_protocol_to_descriptor::descriptors._M_elems[0].protocol.super_udp.family_ +
         lVar2);
}

Assistant:

node::protocol_descriptor const& node::map_protocol_to_descriptor(udp const protocol)
{
	static std::array<protocol_descriptor, 2> const descriptors =
	{{
		{udp::v4(), "n4", "nodes"},
		{udp::v6(), "n6", "nodes6"}
	}};

	auto const iter = std::find_if(descriptors.begin(), descriptors.end()
		, [&protocol](protocol_descriptor const& d) { return d.protocol == protocol; });

	if (iter == descriptors.end())
	{
		TORRENT_ASSERT_FAIL();
		aux::throw_ex<std::out_of_range>("unknown protocol");
	}

	return *iter;
}